

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

int __thiscall QLocalServerPrivate::listen(QLocalServerPrivate *this,int __fd,int __n)

{
  QObject *pQVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  parameter_type pQVar5;
  QSocketNotifier *this_00;
  long in_FS_OFFSET;
  QObject local_c0 [12];
  QFlagsStorage<QLocalServer::SocketOption> local_b4;
  socklen_t len;
  bool abstractAddress;
  sockaddr_un local_a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  this->listenSocket = __fd;
  fcntl(__fd,2,1);
  iVar4 = this->listenSocket;
  uVar3 = fcntl(iVar4,3);
  fcntl(iVar4,4,(ulong)(uVar3 | 0x800));
  abstractAddress = false;
  len = 0x6e;
  local_a8.sun_family = 0;
  local_a8.sun_path[0] = '\0';
  local_a8.sun_path[1] = '\0';
  local_a8.sun_path[2] = '\0';
  local_a8.sun_path[3] = '\0';
  local_a8.sun_path[4] = '\0';
  local_a8.sun_path[5] = '\0';
  local_a8.sun_path[6] = '\0';
  local_a8.sun_path[7] = '\0';
  local_a8.sun_path[8] = '\0';
  local_a8.sun_path[9] = '\0';
  local_a8.sun_path[10] = '\0';
  local_a8.sun_path[0xb] = '\0';
  local_a8.sun_path[0xc] = '\0';
  local_a8.sun_path[0xd] = '\0';
  local_a8.sun_path[0xe] = '\0';
  local_a8.sun_path[0xf] = '\0';
  local_a8.sun_path[0x10] = '\0';
  local_a8.sun_path[0x11] = '\0';
  local_a8.sun_path[0x12] = '\0';
  local_a8.sun_path[0x13] = '\0';
  local_a8.sun_path[0x14] = '\0';
  local_a8.sun_path[0x15] = '\0';
  local_a8.sun_path[0x16] = '\0';
  local_a8.sun_path[0x17] = '\0';
  local_a8.sun_path[0x18] = '\0';
  local_a8.sun_path[0x19] = '\0';
  local_a8.sun_path[0x1a] = '\0';
  local_a8.sun_path[0x1b] = '\0';
  local_a8.sun_path[0x1c] = '\0';
  local_a8.sun_path[0x1d] = '\0';
  local_a8.sun_path[0x1e] = '\0';
  local_a8.sun_path[0x1f] = '\0';
  local_a8.sun_path[0x20] = '\0';
  local_a8.sun_path[0x21] = '\0';
  local_a8.sun_path[0x22] = '\0';
  local_a8.sun_path[0x23] = '\0';
  local_a8.sun_path[0x24] = '\0';
  local_a8.sun_path[0x25] = '\0';
  local_a8.sun_path[0x26] = '\0';
  local_a8.sun_path[0x27] = '\0';
  local_a8.sun_path[0x28] = '\0';
  local_a8.sun_path[0x29] = '\0';
  local_a8.sun_path[0x2a] = '\0';
  local_a8.sun_path[0x2b] = '\0';
  local_a8.sun_path[0x2c] = '\0';
  local_a8.sun_path[0x2d] = '\0';
  local_a8.sun_path[0x2e] = '\0';
  local_a8.sun_path[0x2f] = '\0';
  local_a8.sun_path[0x30] = '\0';
  local_a8.sun_path[0x31] = '\0';
  local_a8.sun_path[0x32] = '\0';
  local_a8.sun_path[0x33] = '\0';
  local_a8.sun_path[0x34] = '\0';
  local_a8.sun_path[0x35] = '\0';
  local_a8.sun_path[0x36] = '\0';
  local_a8.sun_path[0x37] = '\0';
  local_a8.sun_path[0x38] = '\0';
  local_a8.sun_path[0x39] = '\0';
  local_a8.sun_path[0x3a] = '\0';
  local_a8.sun_path[0x3b] = '\0';
  local_a8.sun_path[0x3c] = '\0';
  local_a8.sun_path[0x3d] = '\0';
  local_a8.sun_path[0x3e] = '\0';
  local_a8.sun_path[0x3f] = '\0';
  local_a8.sun_path[0x40] = '\0';
  local_a8.sun_path[0x41] = '\0';
  local_a8.sun_path[0x42] = '\0';
  local_a8.sun_path[0x43] = '\0';
  local_a8.sun_path[0x44] = '\0';
  local_a8.sun_path[0x45] = '\0';
  local_a8.sun_path[0x46] = '\0';
  local_a8.sun_path[0x47] = '\0';
  local_a8.sun_path[0x48] = '\0';
  local_a8.sun_path[0x49] = '\0';
  local_a8.sun_path[0x4a] = '\0';
  local_a8.sun_path[0x4b] = '\0';
  local_a8.sun_path[0x4c] = '\0';
  local_a8.sun_path[0x4d] = '\0';
  local_a8.sun_path[0x4e] = '\0';
  local_a8.sun_path[0x4f] = '\0';
  local_a8.sun_path[0x50] = '\0';
  local_a8.sun_path[0x51] = '\0';
  local_a8.sun_path[0x52] = '\0';
  local_a8.sun_path[0x53] = '\0';
  local_a8.sun_path[0x54] = '\0';
  local_a8.sun_path[0x55] = '\0';
  local_a8.sun_path[0x56] = '\0';
  local_a8.sun_path[0x57] = '\0';
  local_a8.sun_path[0x58] = '\0';
  local_a8.sun_path[0x59] = '\0';
  local_a8.sun_path[0x5a] = '\0';
  local_a8.sun_path[0x5b] = '\0';
  local_a8.sun_path[0x5c] = '\0';
  local_a8.sun_path[0x5d] = '\0';
  local_a8.sun_path[0x5e] = '\0';
  local_a8.sun_path[0x5f] = '\0';
  local_a8.sun_path[0x60] = '\0';
  local_a8.sun_path[0x61] = '\0';
  local_a8.sun_path[0x62] = '\0';
  local_a8.sun_path[99] = '\0';
  local_a8.sun_path[100] = '\0';
  local_a8.sun_path[0x65] = '\0';
  local_a8.sun_path[0x66] = '\0';
  local_a8.sun_path[0x67] = '\0';
  local_a8.sun_path[0x68] = '\0';
  local_a8.sun_path[0x69] = '\0';
  local_a8.sun_path[0x6a] = '\0';
  local_a8.sun_path[0x6b] = '\0';
  iVar4 = getsockname(__fd,(sockaddr *)&local_a8,&len);
  if (iVar4 == 0) {
    bVar2 = QLocalSocketPrivate::parseSockaddr
                      (&local_a8,len,&this->fullServerName,&this->serverName,&abstractAddress);
    if (bVar2) {
      pQVar5 = QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
               ::value(&this->socketOptions);
      local_b4.i = ((pQVar5->super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>).
                    super_QFlagsStorage<QLocalServer::SocketOption>.i & 0xfffffff7) +
                   (uint)abstractAddress * 8;
      QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
      ::setValue(&this->socketOptions,(parameter_type)&local_b4);
    }
  }
  this_00 = (QSocketNotifier *)operator_new(0x10);
  QSocketNotifier::QSocketNotifier(this_00,(long)this->listenSocket,Read,pQVar1);
  this->socketNotifier = this_00;
  QObject::connect(local_c0,(char *)this_00,(QObject *)"2activated(QSocketDescriptor)",
                   (char *)pQVar1,0x261a76);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),1);
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServerPrivate::listen(qintptr socketDescriptor)
{
    Q_Q(QLocalServer);

    // Attach to the localsocket
    listenSocket = socketDescriptor;

    ::fcntl(listenSocket, F_SETFD, FD_CLOEXEC);
    ::fcntl(listenSocket, F_SETFL, ::fcntl(listenSocket, F_GETFL) | O_NONBLOCK);

    bool abstractAddress = false;
    struct ::sockaddr_un addr;
    QT_SOCKLEN_T len = sizeof(addr);
    memset(&addr, 0, sizeof(addr));
    if (::getsockname(socketDescriptor, (sockaddr *)&addr, &len) == 0) {
#if defined(Q_OS_QNX)
        if (addr.sun_path[0] == 0 && addr.sun_path[1] == 0)
            len = SUN_LEN(&addr);
#endif
        if (QLocalSocketPrivate::parseSockaddr(addr, len, fullServerName, serverName,
                                               abstractAddress)) {
            QLocalServer::SocketOptions options = socketOptions.value();
            socketOptions = options.setFlag(QLocalServer::AbstractNamespaceOption, abstractAddress);
        }
    }

    Q_ASSERT(!socketNotifier);
    socketNotifier = new QSocketNotifier(listenSocket,
                                         QSocketNotifier::Read, q);
    q->connect(socketNotifier, SIGNAL(activated(QSocketDescriptor)),
               q, SLOT(_q_onNewConnection()));
    socketNotifier->setEnabled(maxPendingConnections > 0);
    return true;
}